

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_expression_lhs.hpp
# Opt level: O2

ResultBuilder * __thiscall
Catch::ExpressionLhs<int_const&>::captureExpression<(Catch::Internal::Operator)0,unsigned_long>
          (ExpressionLhs<int_const&> *this,unsigned_long *rhs)

{
  uint uVar1;
  ResultBuilder *pRVar2;
  OfType OVar3;
  int in_EDX;
  unsigned_long value;
  allocator local_79;
  string local_78 [32];
  string local_58;
  string local_38;
  
  pRVar2 = *(ResultBuilder **)this;
  uVar1 = **(uint **)(this + 8);
  OVar3 = ExpressionFailed;
  if ((Catch *)*rhs == (Catch *)(ulong)uVar1) {
    OVar3 = Ok;
  }
  (pRVar2->m_data).resultType = OVar3;
  Catch::toString_abi_cxx11_(&local_38,(Catch *)(ulong)uVar1,in_EDX);
  std::__cxx11::string::_M_assign((string *)&(pRVar2->m_exprComponents).lhs);
  Catch::toString_abi_cxx11_(&local_58,(Catch *)*rhs,value);
  std::__cxx11::string::_M_assign((string *)&(pRVar2->m_exprComponents).rhs);
  std::__cxx11::string::string(local_78,"==",&local_79);
  std::__cxx11::string::_M_assign((string *)&(pRVar2->m_exprComponents).op);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return pRVar2;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }